

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhash_kv_config(unqlite_kv_engine *pEngine,int op,__va_list_tag *ap)

{
  uint uVar1;
  long *local_70;
  long *local_58;
  ProcCmp xCmp;
  ProcHash xHash;
  int rc;
  lhash_kv_engine *pHash;
  __va_list_tag *ap_local;
  int op_local;
  unqlite_kv_engine *pEngine_local;
  
  xHash._4_4_ = 0;
  if (op == 1) {
    if (*(int *)&pEngine[0x1c].pIo == 0) {
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_58 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_58 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_58 + 1;
      }
      if ((unqlite_kv_io *)*local_58 != (unqlite_kv_io *)0x0) {
        pEngine[0x18].pIo = (unqlite_kv_io *)*local_58;
      }
    }
    else {
      xHash._4_4_ = -4;
    }
  }
  else if (op == 2) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_70 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_70 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_70 + 1;
    }
    if ((unqlite_kv_io *)*local_70 != (unqlite_kv_io *)0x0) {
      pEngine[0x19].pIo = (unqlite_kv_io *)*local_70;
    }
  }
  else {
    xHash._4_4_ = -0xd;
  }
  return xHash._4_4_;
}

Assistant:

static int lhash_kv_config(unqlite_kv_engine *pEngine,int op,va_list ap)
{
	lhash_kv_engine *pHash = (lhash_kv_engine *)pEngine;
	int rc = UNQLITE_OK;
	switch(op){
	case UNQLITE_KV_CONFIG_HASH_FUNC: {
		/* Default hash function */
		if( pHash->nBuckRec > 0 ){
			/* Locked operation */
			rc = UNQLITE_LOCKED;
		}else{
			ProcHash xHash = va_arg(ap,ProcHash);
			if( xHash ){
				pHash->xHash = xHash;
			}
		}
		break;
									  }
	case UNQLITE_KV_CONFIG_CMP_FUNC: {
		/* Default comparison function */
		ProcCmp xCmp = va_arg(ap,ProcCmp);
		if( xCmp ){
			pHash->xCmp  = xCmp;
		}
		break;
									 }
	default:
		/* Unknown OP */
		rc = UNQLITE_UNKNOWN;
		break;
	}
	return rc;
}